

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::notes(ostream *out,elfio *reader)

{
  elfio *peVar1;
  __uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_> section;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Elf_Word EVar5;
  ulong uVar6;
  Elf_Word j_1;
  Elf_Word j;
  Elf_Word EVar7;
  pointer puVar8;
  Elf_Word descsz;
  Elf_Word type;
  Sections *__range2;
  char *desc;
  string name;
  note_section_accessor notes;
  ushort local_a0;
  Elf_Word local_98;
  Elf_Word local_94;
  elfio *local_90;
  pointer local_88;
  char *local_80;
  string local_78;
  note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> local_58;
  
  peVar1 = (reader->sections).parent;
  local_88 = (peVar1->sections_).
             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = reader;
  for (puVar8 = (peVar1->sections_).
                super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != local_88; puVar8 = puVar8 + 1)
  {
    iVar3 = (*((puVar8->_M_t).
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
               super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[5])();
    if (iVar3 == 7) {
      note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      note_section_accessor_template
                (&local_58,local_90,
                 (puVar8->_M_t).
                 super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                 super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                 super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl);
      EVar5 = (Elf_Word)
              ((ulong)((long)local_58.note_start_positions.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.note_start_positions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (EVar5 != 0) {
        poVar4 = std::operator<<(out,"Note section (");
        (*((puVar8->_M_t).
           super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
           super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[3])
                  (&local_78);
        poVar4 = std::operator<<(poVar4,(string *)&local_78);
        poVar4 = std::operator<<(poVar4,")");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"    No Name         Data size  Description");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_78);
        for (EVar7 = 0; EVar5 != EVar7; EVar7 = EVar7 + 1) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          local_78._M_string_length = 0;
          local_78.field_2._M_local_buf[0] = '\0';
          bVar2 = note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
                  get_note(&local_58,EVar7,&local_94,&local_78,&local_80,&local_98);
          if (bVar2) {
            std::__cxx11::string::assign((char *)&local_78);
            note(out,EVar7,local_94,&local_78,local_80,local_98);
            std::endl<char,std::char_traits<char>>(out);
          }
          std::__cxx11::string::~string((string *)&local_78);
        }
        std::endl<char,std::char_traits<char>>(out);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&local_58.note_start_positions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
  }
  peVar1 = (local_90->segments).parent;
  local_88 = (pointer)(ulong)((uint)(*(int *)&(peVar1->segments_).
                                              super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                    *(int *)&(peVar1->segments_).
                                             super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                             0xffff);
  for (uVar6 = 0; (pointer)uVar6 != local_88; uVar6 = uVar6 + 1) {
    section._M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
    super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl =
         (((local_90->segments).parent)->segments_).
         super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
         super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t;
    iVar3 = (*(*(_func_int ***)
                section._M_t.
                super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl)[3])
                      (section._M_t.
                       super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>
                       .super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl);
    if (iVar3 == 4) {
      note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
      note_section_accessor_template
                ((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size> *)
                 &local_58,local_90,
                 (segment *)
                 section._M_t.
                 super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                 super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl);
      EVar5 = (Elf_Word)
              ((ulong)((long)local_58.note_start_positions.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.note_start_positions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (EVar5 != 0) {
        poVar4 = std::operator<<(out,"Note segment (");
        local_a0 = (ushort)uVar6;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_a0);
        poVar4 = std::operator<<(poVar4,")");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"    No Name         Data size  Description");
        std::endl<char,std::char_traits<char>>(poVar4);
        for (EVar7 = 0; EVar5 != EVar7; EVar7 = EVar7 + 1) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          local_78._M_string_length = 0;
          local_78.field_2._M_local_buf[0] = '\0';
          bVar2 = note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
                  get_note((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>
                            *)&local_58,EVar7,&local_94,&local_78,&local_80,&local_98);
          if (bVar2) {
            std::__cxx11::string::assign((char *)&local_78);
            note(out,EVar7,local_94,&local_78,local_80,local_98);
            std::endl<char,std::char_traits<char>>(out);
          }
          std::__cxx11::string::~string((string *)&local_78);
        }
        std::endl<char,std::char_traits<char>>(out);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&local_58.note_start_positions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
  }
  return;
}

Assistant:

static void notes( std::ostream& out, const elfio& reader )
    {
        for ( const auto& sec : reader.sections ) { // For all sections
            if ( SHT_NOTE == sec->get_type() ) {    // Look at notes
                note_section_accessor notes( reader, sec.get() );
                Elf_Word              no_notes = notes.get_notes_num();

                if ( no_notes == 0 )
                    continue;

                out << "Note section (" << sec->get_name() << ")" << std::endl
                    << "    No Name         Data size  Description"
                    << std::endl;
                for ( Elf_Word j = 0; j < no_notes; ++j ) { // For all notes
                    Elf_Word    type;
                    std::string name;
                    char*       desc;
                    Elf_Word    descsz;

                    if ( notes.get_note( j, type, name, desc, descsz ) ) {
                        // 'name' usually contains \0 at the end. Remove it
                        name = name.c_str();
                        note( out, j, type, name, desc, descsz );
                        out << std::endl;
                    }
                }

                out << std::endl;
            }
        }

        Elf_Half no = reader.segments.size();
        for ( Elf_Half i = 0; i < no; ++i ) { // For all segments
            segment* seg = reader.segments[i];
            if ( PT_NOTE == seg->get_type() ) { // Look at notes
                note_segment_accessor notes( reader, seg );
                Elf_Word              no_notes = notes.get_notes_num();

                if ( no_notes == 0 )
                    continue;

                out << "Note segment (" << i << ")" << std::endl
                    << "    No Name         Data size  Description"
                    << std::endl;
                for ( Elf_Word j = 0; j < no_notes; ++j ) { // For all notes
                    Elf_Word    type;
                    std::string name;
                    char*       desc;
                    Elf_Word    descsz;

                    if ( notes.get_note( j, type, name, desc, descsz ) ) {
                        // 'name' usually contains \0 at the end. Remove it
                        name = name.c_str();
                        note( out, j, type, name, desc, descsz );
                        out << std::endl;
                    }
                }

                out << std::endl;
            }
        }
    }